

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildProfiledReg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  ushort *puVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  OpCode local_2a [4];
  OpCode newOpcode_local;
  
  local_2a[0] = newOpcode;
  bVar3 = OpCodeAttr::IsProfiledOp(newOpcode);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x7f5,"(OpCodeAttr::IsProfiledOp(newOpcode))",
                       "OpCodeAttr::IsProfiledOp(newOpcode)");
    if (!bVar3) goto LAB_004de8c0;
    *puVar4 = 0;
  }
  bVar3 = OpCodeAttr::HasMultiSizeLayout(local_2a[0]);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x7f6,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) goto LAB_004de8c0;
    *puVar4 = 0;
  }
  puVar1 = (ushort *)(this->m_jnReader).m_currentLocation;
  (this->m_jnReader).m_currentLocation = (byte *)(puVar1 + 4);
  if ((this->m_jnReader).m_endLocation < puVar1 + 4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/ByteCode/ByteCodeReader.h"
                       ,0x68,"(m_currentLocation <= m_endLocation)",
                       "m_currentLocation <= m_endLocation");
    if (!bVar3) {
LAB_004de8c0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,ClosureRegCheckPhase,sourceContextId,functionId);
  if (!bVar3) {
    DoClosureRegCheck(this,(uint)*puVar1);
    DoClosureRegCheck(this,(uint)puVar1[1]);
    DoClosureRegCheck(this,(uint)puVar1[2]);
  }
  Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(local_2a);
  BuildReg3(this,local_2a[0],offset,(uint)*puVar1,(uint)puVar1[1],(uint)puVar1[2],puVar1[3]);
  return;
}

Assistant:

void
IRBuilder::BuildProfiledReg3(Js::OpCode newOpcode, uint32 offset)
{
    Assert(OpCodeAttr::IsProfiledOp(newOpcode));
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));
    auto layout = m_jnReader.GetLayout<Js::OpLayoutDynamicProfile<Js::OpLayoutT_Reg3<SizePolicy>>>();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(layout->R0);
        this->DoClosureRegCheck(layout->R1);
        this->DoClosureRegCheck(layout->R2);
    }

    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);
    BuildReg3(newOpcode, offset, layout->R0, layout->R1, layout->R2, layout->profileId);
}